

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::processM2TSPCR(TSMuxer *this,int64_t pcrVal,int64_t pcrGAP)

{
  MuxerManager *this_00;
  int iVar1;
  uint32_t uVar2;
  longlong lVar3;
  int j;
  int iVar4;
  pointer ppVar5;
  uint32_t *cur_1;
  uint32_t *cur;
  uint32_t *puVar6;
  long lVar7;
  iterator __begin2;
  pointer ppVar8;
  uint32_t *puVar9;
  double __x;
  double dVar10;
  
  iVar1 = 0;
  ppVar8 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (ppVar5 = ppVar8;
      ppVar5 != (this->m_m2tsDelayBlocks).
                super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
    iVar1 = iVar1 + ppVar5->second;
  }
  iVar4 = this->m_prevM2TSPCROffset;
  iVar1 = (iVar1 - iVar4) + this->m_outBufLen;
  if (0x1555554 < (iVar1 * -0x55555555 + 0x2aaaaa80U >> 6 | iVar1 * -0x54000000)) {
    __assert_fail("byteCnt % 192 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                  ,0x1f1,"int TSMuxer::calcM2tsFrameCnt() const");
  }
  lVar7 = pcrVal * 300 - pcrGAP;
  ppVar5 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar10 = (double)(lVar7 - this->m_prevM2TSPCR) / (double)(iVar1 / 0xc0);
  __x = (double)this->m_prevM2TSPCR;
  if (ppVar8 != ppVar5) {
    do {
      iVar1 = ppVar8->second;
      if (iVar4 < iVar1) {
        puVar6 = (uint32_t *)(ppVar8->first + iVar4);
        do {
          __x = __x + dVar10;
          lVar3 = llround(__x);
          uVar2 = my_ntohl((uint)lVar3 & 0x3fffffff);
          *puVar6 = uVar2;
          puVar6 = puVar6 + 0x30;
          iVar4 = iVar4 + 0xc0;
          iVar1 = ppVar8->second;
        } while (iVar4 < iVar1);
      }
      this_00 = (this->super_AbstractMuxer).m_owner;
      if (this_00->m_asyncMode == true) {
        MuxerManager::asyncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,ppVar8->first,iVar1,this->m_muxFile);
      }
      else {
        MuxerManager::syncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,ppVar8->first,iVar1,this->m_muxFile);
        if (ppVar8->first != (uchar *)0x0) {
          operator_delete__(ppVar8->first);
        }
      }
      iVar4 = iVar4 - ppVar8->second;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar5);
    this->m_prevM2TSPCROffset = iVar4;
    ppVar8 = (this->m_m2tsDelayBlocks).
             super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_m2tsDelayBlocks).
        super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar8) {
      (this->m_m2tsDelayBlocks).
      super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar8;
    }
  }
  puVar6 = (uint32_t *)(this->m_outBuf + this->m_prevM2TSPCROffset);
  puVar9 = (uint32_t *)(this->m_outBuf + this->m_outBufLen);
  if (this->m_prevM2TSPCROffset < this->m_outBufLen) {
    do {
      __x = __x + dVar10;
      lVar3 = llround(__x);
      uVar2 = my_ntohl((uint)lVar3 & 0x3fffffff);
      *puVar6 = uVar2;
      puVar6 = puVar6 + 0x30;
    } while (puVar6 < puVar9);
  }
  if (puVar6 == puVar9) {
    this->m_prevM2TSPCROffset = this->m_outBufLen;
    this->m_prevM2TSPCR = lVar7;
    return;
  }
  __assert_fail("curPos == end",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                ,0x21e,"void TSMuxer::processM2TSPCR(const int64_t, const int64_t)");
}

Assistant:

void TSMuxer::processM2TSPCR(const int64_t pcrVal, const int64_t pcrGAP)
{
    const int m2tsFrameCnt = calcM2tsFrameCnt();
    const int64_t hiResPCR = pcrVal * 300 - pcrGAP;
    const int64_t pcrValDif = hiResPCR - m_prevM2TSPCR;  // m2ts pcr clock based on full 27Mhz counter
    const double pcrIncPerFrame = static_cast<double>(pcrValDif) / m2tsFrameCnt;

    auto curM2TSPCR = static_cast<double>(m_prevM2TSPCR);
    uint8_t* curPos;
    if (!m_m2tsDelayBlocks.empty())
    {
        int offset = m_prevM2TSPCROffset;
        for (const auto& i : m_m2tsDelayBlocks)
        {
            curPos = i.first + offset;
            int j = offset;
            for (; j < i.second; j += 192)
            {
                curM2TSPCR += pcrIncPerFrame;
                writeM2TSHeader(curPos, llround(curM2TSPCR));
                curPos += 192;
            }
            if (m_owner->isAsyncMode())
                m_owner->asyncWriteBuffer(this, i.first, i.second, m_muxFile);
            else
            {
                m_owner->syncWriteBuffer(this, i.first, i.second, m_muxFile);
                delete[] i.first;
            }
            offset = j - i.second;
        }
        m_prevM2TSPCROffset = offset;
        m_m2tsDelayBlocks.clear();
    }
    curPos = m_outBuf + m_prevM2TSPCROffset;
    const uint8_t* end = m_outBuf + m_outBufLen;
    for (; curPos < end; curPos += 192)
    {
        curM2TSPCR += pcrIncPerFrame;
        writeM2TSHeader(curPos, llround(curM2TSPCR));
    }
    assert(curPos == end);
    m_prevM2TSPCROffset = m_outBufLen;
    // assert((int64_t) curM2TSPCR == hiResPCR);
    m_prevM2TSPCR = hiResPCR;
}